

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O3

string * __thiscall
PacketProcessor::GetFamilyName_abi_cxx11_
          (string *__return_storage_ptr__,PacketProcessor *this,PacketFamily family)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "INTERNAL";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "Connection";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Account";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "Character";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "Login";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "Welcome";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "Walk";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "Face";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "Chair";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "Emote";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "Attack";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "Spell";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "Shop";
    pcVar1 = "";
    break;
  case 0xe:
    pcVar2 = "Item";
    pcVar1 = "";
    break;
  case 0x10:
    pcVar2 = "StatSkill";
    pcVar1 = "";
    break;
  case 0x11:
    pcVar2 = "Global";
    pcVar1 = "";
    break;
  case 0x12:
    pcVar2 = "Talk";
    pcVar1 = "";
    break;
  case 0x13:
    pcVar2 = "Warp";
    pcVar1 = "";
    break;
  case 0x15:
    pcVar2 = "Jukebox";
    pcVar1 = "";
    break;
  case 0x16:
    pcVar2 = "Players";
    pcVar1 = "";
    break;
  case 0x17:
    pcVar2 = "Avatar";
    pcVar1 = "";
    break;
  case 0x18:
    pcVar2 = "Party";
    pcVar1 = "";
    break;
  case 0x19:
    pcVar2 = "Refresh";
    pcVar1 = "";
    break;
  case 0x1a:
    pcVar2 = "NPC";
    pcVar1 = "";
    break;
  case 0x1b:
    pcVar2 = "Player_Range";
    pcVar1 = "";
    break;
  case 0x1c:
    pcVar2 = "NPC_Range";
    pcVar1 = "";
    break;
  case 0x1d:
    pcVar2 = "Range";
    pcVar1 = "";
    break;
  case 0x1e:
    pcVar2 = "Paperdoll";
    pcVar1 = "";
    break;
  case 0x1f:
    pcVar2 = "Effect";
    pcVar1 = "";
    break;
  case 0x20:
    pcVar2 = "Trade";
    pcVar1 = "";
    break;
  case 0x21:
    pcVar2 = "Chest";
    pcVar1 = "";
    break;
  case 0x22:
    pcVar2 = "Door";
    pcVar1 = "";
    break;
  case 0x23:
    pcVar2 = "Message";
    pcVar1 = "";
    break;
  case 0x24:
    pcVar2 = "Bank";
    pcVar1 = "";
    break;
  case 0x25:
    pcVar2 = "Locker";
    pcVar1 = "";
    break;
  case 0x26:
    pcVar2 = "Barber";
    pcVar1 = "";
    break;
  case 0x27:
    pcVar2 = "Guild";
    pcVar1 = "";
    break;
  case 0x28:
    pcVar2 = "Music";
    pcVar1 = "";
    break;
  case 0x29:
    pcVar2 = "Sit";
    pcVar1 = "";
    break;
  case 0x2a:
    pcVar2 = "Recover";
    pcVar1 = "";
    break;
  case 0x2b:
    pcVar2 = "Board";
    pcVar1 = "";
    break;
  case 0x2c:
    pcVar2 = "Cast";
    pcVar1 = "";
    break;
  case 0x2d:
    pcVar2 = "Arena";
    pcVar1 = "";
    break;
  case 0x2e:
    pcVar2 = "Priest";
    pcVar1 = "";
    break;
  case 0x2f:
    pcVar2 = "Marriage";
    pcVar1 = "";
    break;
  case 0x30:
    pcVar2 = "AdminInteract";
    pcVar1 = "";
    break;
  case 0x31:
    pcVar2 = "Citizen";
    pcVar1 = "";
    break;
  case 0x32:
    pcVar2 = "Quest";
    pcVar1 = "";
    break;
  case 0x33:
    pcVar2 = "Book";
    pcVar1 = "";
    break;
  default:
    if ((int)this == 0xff) {
      pcVar2 = "Init";
      pcVar1 = "";
      break;
    }
  case 10:
  case 0xf:
  case 0x14:
    pcVar2 = "UNKNOWN";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string PacketProcessor::GetFamilyName(PacketFamily family)
{
	switch (family)
	{
		case PACKET_INTERNAL: return "INTERNAL";
		case PACKET_CONNECTION: return "Connection";
		case PACKET_ACCOUNT: return "Account";
		case PACKET_CHARACTER: return "Character";
		case PACKET_LOGIN: return "Login";
		case PACKET_WELCOME: return "Welcome";
		case PACKET_WALK: return "Walk";
		case PACKET_FACE: return "Face";
		case PACKET_CHAIR: return "Chair";
		case PACKET_EMOTE: return "Emote";
		case PACKET_ATTACK: return "Attack";
		case PACKET_SPELL: return "Spell";
		case PACKET_SHOP: return "Shop";
		case PACKET_ITEM: return "Item";
		case PACKET_STATSKILL: return "StatSkill";
		case PACKET_GLOBAL: return "Global";
		case PACKET_TALK: return "Talk";
		case PACKET_WARP: return "Warp";
		case PACKET_JUKEBOX: return "Jukebox";
		case PACKET_PLAYERS: return "Players";
		case PACKET_AVATAR: return "Avatar";
		case PACKET_PARTY: return "Party";
		case PACKET_REFRESH: return "Refresh";
		case PACKET_NPC: return "NPC";
		case PACKET_PLAYER_RANGE: return "Player_Range";
		case PACKET_NPC_RANGE: return "NPC_Range";
		case PACKET_RANGE: return "Range";
		case PACKET_PAPERDOLL: return "Paperdoll";
		case PACKET_EFFECT: return "Effect";
		case PACKET_TRADE: return "Trade";
		case PACKET_CHEST: return "Chest";
		case PACKET_DOOR: return "Door";
		case PACKET_MESSAGE: return "Message";
		case PACKET_BANK: return "Bank";
		case PACKET_LOCKER: return "Locker";
		case PACKET_BARBER: return "Barber";
		case PACKET_GUILD: return "Guild";
		case PACKET_MUSIC: return "Music";
		case PACKET_SIT: return "Sit";
		case PACKET_RECOVER: return "Recover";
		case PACKET_BOARD: return "Board";
		case PACKET_CAST: return "Cast";
		case PACKET_ARENA: return "Arena";
		case PACKET_PRIEST: return "Priest";
		case PACKET_MARRIAGE: return "Marriage";
		case PACKET_ADMININTERACT: return "AdminInteract";
		case PACKET_CITIZEN: return "Citizen";
		case PACKET_QUEST: return "Quest";
		case PACKET_BOOK: return "Book";
		case PACKET_F_INIT: return "Init";
		default: return "UNKNOWN";
	}
}